

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::skip_delimited_group(CTcTokenizer *this,utf8_ptr *p,int parts_to_skip)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = utf8_ptr::getch(p);
  if ((wVar1 & 0xfffffffbU) == 0) {
    return;
  }
  utf8_ptr::inc(p);
LAB_0021cf5c:
  do {
    while( true ) {
      if (parts_to_skip == 0) {
        return;
      }
      wVar2 = utf8_ptr::getch(p);
      if ((wVar2 & 0xfffffffbU) == 0) {
        return;
      }
      if (wVar2 != wVar1) break;
      parts_to_skip = parts_to_skip + -1;
LAB_0021cfa2:
      utf8_ptr::inc(p);
    }
    if (wVar2 != L'\x05') {
      if (1 < (uint)(wVar2 + L'\xfffffff9')) goto LAB_0021cfa2;
      skip_delimited_group(this,p,1);
      goto LAB_0021cf5c;
    }
    skip_delimited_group(this,p,2);
  } while( true );
}

Assistant:

void CTcTokenizer::skip_delimited_group(utf8_ptr *p, int parts_to_skip)
{
    wchar_t delim;

    /* get the delimiter character */
    delim = p->getch();

    /* 
     *   if the delimiter put us at the end of the line, there's nothing to
     *   skip 
     */
    if (delim == 0 || delim == TOK_END_PP_LINE)
        return;

    /* skip the delimiter */
    p->inc();

    /* keep going until we've skipped the desired number of parts */
    while (parts_to_skip != 0)
    {
        wchar_t ch;

        /* read the next character */
        ch = p->getch();

        /* if it's the end of the line, give up */
        if (ch == 0 || ch == TOK_END_PP_LINE)
        {
            /* 
             *   we ran out of input before reaching the delimiter, so this
             *   is implicitly the end of it 
             */
            return;
        }

        /* check what we have */
        if (ch == delim)
        {
            /* that's one less part to skip */
            --parts_to_skip;

            /* skip it */
            p->inc();
        }
        else if (ch == TOK_MACRO_FOREACH_FLAG)
        {
            /* it's a nested #foreach - skip all of its parts */
            skip_delimited_group(p, 2);
        }
        else if (ch == TOK_MACRO_IFEMPTY_FLAG
                 || ch == TOK_MACRO_IFNEMPTY_FLAG)
        {
            /* nested #ifempty or #ifnempty - skip its expansion */
            skip_delimited_group(p, 1);
        }
        else
        {
            /* it's nothing special to us - skip it */
            p->inc();
        }
    }
}